

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactQuantizedBvh.cpp
# Opt level: O2

void __thiscall
cbtQuantizedBvhTree::build_tree(cbtQuantizedBvhTree *this,GIM_BVH_DATA_ARRAY *primitive_boxes)

{
  BT_QUANTIZED_BVH_NODE local_20;
  
  calc_quantization(this,primitive_boxes,1.0);
  this->m_num_nodes = 0;
  local_20.m_escapeIndexOrDataIndex = 0;
  cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE>::resize
            (&(this->m_node_array).super_cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE>,
             (primitive_boxes->super_cbtAlignedObjectArray<GIM_BVH_DATA>).m_size * 2,&local_20);
  _build_sub_tree(this,primitive_boxes,0,
                  (primitive_boxes->super_cbtAlignedObjectArray<GIM_BVH_DATA>).m_size);
  return;
}

Assistant:

void cbtQuantizedBvhTree::build_tree(
	GIM_BVH_DATA_ARRAY& primitive_boxes)
{
	calc_quantization(primitive_boxes);
	// initialize node count to 0
	m_num_nodes = 0;
	// allocate nodes
	m_node_array.resize(primitive_boxes.size() * 2);

	_build_sub_tree(primitive_boxes, 0, primitive_boxes.size());
}